

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_getopt_free(char **opts)

{
  long lVar1;
  long lVar2;
  char **o2;
  char **local_18;
  
  lVar2 = 0;
  local_18 = opts;
  while( true ) {
    if (opts == (char **)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = (long)*(int *)(opts + -2);
    }
    if (lVar1 <= lVar2) break;
    free(opts[lVar2]);
    lVar2 = lVar2 + 1;
  }
  stb_arr_free_(&local_18);
  return;
}

Assistant:

void   stb_getopt_free(char **opts)
{
   int i;
   char ** o2 = opts;
   for (i=0; i < stb_arr_len(o2); ++i)
      free(o2[i]);
   stb_arr_free(o2);
}